

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O0

int avl_insert(avl_tree *tree,avl_node *new)

{
  list_entity *plVar1;
  int local_5c;
  avl_node *paStack_58;
  int diff;
  avl_node *last;
  avl_node *node;
  avl_node *new_local;
  avl_tree *tree_local;
  
  new->parent = (avl_node *)0x0;
  new->left = (avl_node *)0x0;
  new->right = (avl_node *)0x0;
  new->balance = '\0';
  new->follower = false;
  if (tree->root == (avl_node *)0x0) {
    plVar1 = (tree->list_head).next;
    (new->list).next = plVar1;
    (new->list).prev = &tree->list_head;
    plVar1->prev = &new->list;
    (tree->list_head).next = &new->list;
    tree->root = new;
    tree->count = 1;
    tree_local._4_4_ = 0;
  }
  else {
    node = new;
    new_local = (avl_node *)tree;
    last = _avl_find_rec(tree->root,new->key,tree->comp,&local_5c);
    local_5c = (*(code *)new_local->right)(node->key,last->key);
    if (local_5c == 0) {
      if (((ulong)new_local->left & 0x100000000) == 0) {
        tree_local._4_4_ = -1;
      }
      else {
        node->follower = true;
        _avl_insert_after((avl_tree *)new_local,last,node);
        tree_local._4_4_ = 0;
      }
    }
    else {
      node->parent = last;
      if (last->balance == '\x01') {
        _avl_insert_before((avl_tree *)new_local,last,node);
        last->balance = '\0';
        last->left = node;
        tree_local._4_4_ = 0;
      }
      else if (last->balance == -1) {
        paStack_58 = _avl_find_last((avl_tree *)new_local,last);
        _avl_insert_after((avl_tree *)new_local,paStack_58,node);
        last->balance = '\0';
        last->right = node;
        tree_local._4_4_ = 0;
      }
      else {
        if (local_5c < 0) {
          _avl_insert_before((avl_tree *)new_local,last,node);
          last->balance = -1;
          last->left = node;
          _post_insert((avl_tree *)new_local,last);
        }
        else {
          paStack_58 = _avl_find_last((avl_tree *)new_local,last);
          _avl_insert_after((avl_tree *)new_local,paStack_58,node);
          last->balance = '\x01';
          last->right = node;
          _post_insert((avl_tree *)new_local,last);
        }
        tree_local._4_4_ = 0;
      }
    }
  }
  return tree_local._4_4_;
}

Assistant:

int
avl_insert(struct avl_tree *tree, struct avl_node *new) {
  struct avl_node *node, *last;
  int diff;

  new->parent = NULL;

  new->left = NULL;
  new->right = NULL;

  new->balance = 0;
  new->follower = false;

  if (tree->root == NULL) {
    list_add_head(&tree->list_head, &new->list);
    tree->root = new;
    tree->count = 1;
    return 0;
  }

  node = _avl_find_rec(tree->root, new->key, tree->comp, &diff);

  diff = (*tree->comp)(new->key, node->key);

  if (diff == 0) {
    if (!tree->allow_dups)
      return -1;

    new->follower = true;

    /* add new node outside the tree, because key is already present */
    _avl_insert_after(tree, node, new);
    return 0;
  }

  new->parent = node;

  if (node->balance == 1) {
    _avl_insert_before(tree, node, new);
    node->balance = 0;
    node->left = new;
    return 0;
  }

  if (node->balance == -1) {
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 0;
    node->right = new;
    return 0;
  }

  if (diff < 0) {
    _avl_insert_before(tree, node, new);

    node->balance = -1;
    node->left = new;
    _post_insert(tree, node);
  }
  else { /* diff > 0 */
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 1;
    node->right = new;
    _post_insert(tree, node);
  }
  return 0;
}